

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_wav__on_seek_memory_write(void *pUserData,int offset,ma_dr_wav_seek_origin origin)

{
  ma_dr_wav *pWav;
  ma_dr_wav_seek_origin origin_local;
  int offset_local;
  void *pUserData_local;
  
  if (origin == ma_dr_wav_seek_origin_current) {
    offset_local = offset;
    if (offset < 1) {
      if (*(ulong *)((long)pUserData + 0xf8) < (ulong)(long)-offset) {
        offset_local = -(int)*(undefined8 *)((long)pUserData + 0xf8);
      }
    }
    else if (*(ulong *)((long)pUserData + 0xe8) <
             (ulong)(*(long *)((long)pUserData + 0xf8) + (long)offset)) {
      offset_local = (int)*(undefined8 *)((long)pUserData + 0xe8) -
                     (int)*(undefined8 *)((long)pUserData + 0xf8);
    }
    *(long *)((long)pUserData + 0xf8) = (long)offset_local + *(long *)((long)pUserData + 0xf8);
  }
  else if (*(ulong *)((long)pUserData + 0xe8) < (ulong)(uint)offset) {
    *(undefined8 *)((long)pUserData + 0xf8) = *(undefined8 *)((long)pUserData + 0xe8);
  }
  else {
    *(long *)((long)pUserData + 0xf8) = (long)offset;
  }
  return 1;
}

Assistant:

MA_PRIVATE ma_bool32 ma_dr_wav__on_seek_memory_write(void* pUserData, int offset, ma_dr_wav_seek_origin origin)
{
    ma_dr_wav* pWav = (ma_dr_wav*)pUserData;
    MA_DR_WAV_ASSERT(pWav != NULL);
    if (origin == ma_dr_wav_seek_origin_current) {
        if (offset > 0) {
            if (pWav->memoryStreamWrite.currentWritePos + offset > pWav->memoryStreamWrite.dataSize) {
                offset = (int)(pWav->memoryStreamWrite.dataSize - pWav->memoryStreamWrite.currentWritePos);
            }
        } else {
            if (pWav->memoryStreamWrite.currentWritePos < (size_t)-offset) {
                offset = -(int)pWav->memoryStreamWrite.currentWritePos;
            }
        }
        pWav->memoryStreamWrite.currentWritePos += offset;
    } else {
        if ((ma_uint32)offset <= pWav->memoryStreamWrite.dataSize) {
            pWav->memoryStreamWrite.currentWritePos = offset;
        } else {
            pWav->memoryStreamWrite.currentWritePos = pWav->memoryStreamWrite.dataSize;
        }
    }
    return MA_TRUE;
}